

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDeterministicKey.cpp
# Opt level: O1

Blob * jbcoin::generateRootDeterministicPublicKey(Blob *__return_storage_ptr__,uint128 *seed)

{
  BN_CTX *c;
  bignum privKey;
  ec_point pubKey;
  bn_ctx ctx;
  bignum local_30;
  ec_point local_28;
  bn_ctx local_20;
  
  c = BN_CTX_new();
  local_20.ptr = (BN_CTX *)c;
  if (c != (BN_CTX *)0x0) {
    generateRootDeterministicKey((jbcoin *)&local_30,seed);
    openssl::multiply((openssl *)&local_28,openssl::secp256k1curve,&local_30,&local_20);
    BN_clear((BIGNUM *)local_30.ptr);
    serialize_ec_point(__return_storage_ptr__,&local_28);
    EC_POINT_free((EC_POINT *)local_28.ptr);
    openssl::bignum::~bignum(&local_30);
    BN_CTX_free(c);
    return __return_storage_ptr__;
  }
  Throw<std::runtime_error,char_const(&)[20]>((char (*) [20])"BN_CTX_new() failed");
}

Assistant:

Blob generateRootDeterministicPublicKey (uint128 const& seed)
{
    bn_ctx ctx;

    bignum privKey = generateRootDeterministicKey (seed);

    // compute the corresponding public key point
    ec_point pubKey = multiply (secp256k1curve.group, privKey, ctx);

    privKey.clear();  // security erase

    return serialize_ec_point (pubKey);
}